

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::load(Dictionary *this,istream *in)

{
  int32_t iVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  char *in_RSI;
  Dictionary *in_RDI;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 uVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  int32_t i_2;
  int32_t word2intsize;
  int32_t second;
  int32_t first;
  int32_t i_1;
  entry e;
  char c;
  int32_t i;
  key_type *in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar7;
  mapped_type in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_84;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  mapped_type local_78;
  undefined1 local_74 [4];
  int local_70;
  undefined1 local_60 [32];
  Dictionary *in_stack_ffffffffffffffc0;
  undefined1 local_38 [35];
  char local_15;
  int local_14;
  char *local_10;
  
  local_10 = in_RSI;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::clear
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x15811d);
  std::istream::read(local_10,(long)&in_RDI->size_);
  std::istream::read(local_10,(long)&in_RDI->nwords_);
  std::istream::read(local_10,(long)&in_RDI->nlabels_);
  std::istream::read(local_10,(long)&in_RDI->ntokens_);
  std::istream::read(local_10,(long)&in_RDI->pruneidx_size_);
  uVar5 = extraout_XMM0_Qb;
  for (local_14 = 0; local_14 < in_RDI->size_; local_14 = local_14 + 1) {
    entry::entry((entry *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    while( true ) {
      in_stack_ffffffffffffff6c = std::istream::get();
      local_15 = (char)in_stack_ffffffffffffff6c;
      if (local_15 == '\0') break;
      std::__cxx11::string::push_back((char)local_60);
    }
    std::istream::read(local_10,(long)&stack0xffffffffffffffc0);
    std::istream::read(local_10,(long)local_38);
    uVar5 = extraout_XMM0_Qb_00;
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)in_RDI,
               (value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    entry::~entry((entry *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)0x15829c);
  for (local_70 = 0; (long)local_70 < in_RDI->pruneidx_size_; local_70 = local_70 + 1) {
    std::istream::read(local_10,(long)local_74);
    std::istream::read(local_10,(long)&local_78);
    uVar5 = extraout_XMM0_Qb_01;
    in_stack_ffffffffffffff68 = local_78;
    pmVar2 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
    *pmVar2 = in_stack_ffffffffffffff68;
  }
  initTableDiscard((Dictionary *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  initNgrams(in_stack_ffffffffffffffc0);
  auVar4._0_8_ = (double)in_RDI->size_;
  auVar4._8_8_ = uVar5;
  auVar6._0_8_ = auVar4._0_8_ / 0.7;
  auVar6._8_8_ = uVar5;
  vroundsd_avx(auVar4,auVar6,10);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (size_type)in_stack_ffffffffffffff58,(value_type_conflict *)0x158363);
  for (local_84 = 0; local_84 < in_RDI->size_; local_84 = local_84 + 1) {
    this_00 = &in_RDI->word2int_;
    iVar7 = local_84;
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              (&in_RDI->words_,(long)local_84);
    iVar1 = find(in_RDI,(string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar1);
    *pvVar3 = iVar7;
  }
  return;
}

Assistant:

void Dictionary::load(std::istream& in) {
  words_.clear();
  in.read((char*) &size_, sizeof(int32_t));
  in.read((char*) &nwords_, sizeof(int32_t));
  in.read((char*) &nlabels_, sizeof(int32_t));
  in.read((char*) &ntokens_, sizeof(int64_t));
  in.read((char*) &pruneidx_size_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    char c;
    entry e;
    while ((c = in.get()) != 0) {
      e.word.push_back(c);
    }
    in.read((char*) &e.count, sizeof(int64_t));
    in.read((char*) &e.type, sizeof(entry_type));
    words_.push_back(e);
  }
  pruneidx_.clear();
  for (int32_t i = 0; i < pruneidx_size_; i++) {
    int32_t first;
    int32_t second;
    in.read((char*) &first, sizeof(int32_t));
    in.read((char*) &second, sizeof(int32_t));
    pruneidx_[first] = second;
  }
  initTableDiscard();
  initNgrams();

  int32_t word2intsize = std::ceil(size_ / 0.7);
  word2int_.assign(word2intsize, -1);
  for (int32_t i = 0; i < size_; i++) {
    word2int_[find(words_[i].word)] = i;
  }
}